

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshAddTag(FmsMesh mesh,char *tag_name,FmsTag *tag)

{
  ulong uVar1;
  int iVar2;
  FmsInt FVar3;
  FmsTag *__ptr;
  FmsTag str_copy_p;
  int iVar4;
  
  if (mesh == (FmsMesh)0x0) {
    iVar4 = 1;
  }
  else if (tag == (FmsTag *)0x0) {
    iVar4 = 2;
  }
  else {
    uVar1 = mesh->num_tags;
    __ptr = mesh->tags;
    FVar3 = NextPow2(uVar1 + 1);
    iVar4 = 3;
    if (uVar1 <= FVar3 >> 1) {
      __ptr = (FmsTag *)realloc(__ptr,FVar3 << 3);
      if (__ptr == (FmsTag *)0x0) {
        return 3;
      }
      mesh->tags = __ptr;
    }
    str_copy_p = (FmsTag)calloc(1,0x38);
    if (str_copy_p != (FmsTag)0x0) {
      iVar2 = FmsCopyString(tag_name,(char **)str_copy_p);
      if (iVar2 == 0) {
        str_copy_p->tag_type = FMS_NUM_INT_TYPES;
        __ptr[uVar1] = str_copy_p;
        mesh->num_tags = uVar1 + 1;
        *tag = str_copy_p;
        iVar4 = 0;
      }
      else {
        free(str_copy_p);
      }
    }
  }
  return iVar4;
}

Assistant:

int FmsMeshAddTag(FmsMesh mesh, const char *tag_name, FmsTag *tag) {
  if (!mesh) { E_RETURN(1); }
  if (!tag) { E_RETURN(2); }
  FmsInt num_tags = mesh->num_tags;
  FmsTag *tags = mesh->tags;
  // Reallocate mesh->tags, if necessary
  FmsInt nc = NextPow2(num_tags+1);
  if (num_tags <= nc/2) {
    tags = realloc(tags, nc*sizeof(*tags));
    if (tags == NULL) { E_RETURN(3); }
    mesh->tags = tags;
  }
  FmsTag t;
  t = calloc(1, sizeof(*t));
  if (t == NULL) { E_RETURN(3); }
  // On error, call free(t)
  if (FmsCopyString(tag_name, &t->name)) { free(t); E_RETURN(3); }
  t->tag_type = FMS_NUM_INT_TYPES; // invalid type
  tags[num_tags] = t;
  mesh->num_tags = num_tags+1;
  *tag = t;
  return 0;
}